

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<const_void_*const_&> __thiscall
kj::Table<void_const*,kj::HashIndex<kj::_::HashSetCallbacks>>::find<0ul,void_const*&>
          (Table<void_const*,kj::HashIndex<kj::_::HashSetCallbacks>> *this,Entry *params)

{
  Maybe<const_void_*const_&> MVar1;
  ArrayPtr<const_void_*const> table;
  char local_20;
  size_t local_18;
  
  table.size_ = *(size_t *)this;
  table.ptr = (Entry *)(this + 0x20);
  HashIndex<kj::_::HashSetCallbacks>::find<void_const*const,void_const*&>
            ((HashIndex<kj::_::HashSetCallbacks> *)&stack0xffffffffffffffe0,table,
             (Entry *)((long)(*(long *)(this + 8) - *(size_t *)this) >> 3));
  MVar1.ptr = (Entry *)0x0;
  if (local_20 != '\0') {
    MVar1.ptr = (Entry *)(local_18 * 8 + *(long *)this);
  }
  return (Maybe<const_void_*const_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<const Row&> Table<Row, Indexes...>::find(Params&&... params) const {
  KJ_IF_MAYBE(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[*pos];
  } else {
    return nullptr;
  }
}